

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

BOOL Js::JavascriptLibrary::IsFltFunc(BuiltinFunction index)

{
  BOOL BVar1;
  BuiltInFlags BVar2;
  uint uVar3;
  
  BVar1 = CanFloatPreferenceFunc(index);
  if (BVar1 == 0) {
    uVar3 = 0;
  }
  else {
    BVar2 = GetFlagsForBuiltIn(index);
    uVar3 = (uint)((BVar2 & 0xf) == BIF_TypeSpecDstToFloat);
  }
  return uVar3;
}

Assistant:

BOOL JavascriptLibrary::IsFltFunc(BuiltinFunction index)
    {
        // Note: MathFunction is one of built-ins.
        if (!JavascriptLibrary::CanFloatPreferenceFunc(index))
        {
            return FALSE;
        }

        Js::BuiltInFlags builtInFlags = JavascriptLibrary::GetFlagsForBuiltIn(index);
        Js::BuiltInArgSpecializationType dstType = Js::JavascriptLibrary::GetBuiltInArgType(builtInFlags, Js::BuiltInArgShift::BIAS_Dst);
        bool isFloatFunc = dstType == Js::BuiltInArgSpecializationType::BIAST_Float;
        return isFloatFunc;
    }